

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

aiMatrix4x4 * __thiscall
Assimp::X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent
          (aiMatrix4x4 *__return_storage_ptr__,X3DImporter *this)

{
  CX3DImporter_NodeElement *pCVar1;
  reverse_iterator rit;
  _List_node_base *p_Var2;
  list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> matr;
  aiMatrix4x4t<float> temp;
  _List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> local_80;
  aiMatrix4x4t<float> local_68;
  
  p_Var2 = (_List_node_base *)&local_80;
  local_80._M_impl._M_node.super__List_node_base._M_prev = p_Var2;
  local_80._M_impl._M_node._M_size = 0;
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  pCVar1 = this->NodeElement_Cur;
  local_80._M_impl._M_node.super__List_node_base._M_next = p_Var2;
  if (pCVar1 != (CX3DImporter_NodeElement *)0x0) {
    do {
      if (pCVar1->Type == ENET_Group) {
        std::__cxx11::list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                  ((list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)&local_80,
                   (value_type *)(pCVar1 + 1));
      }
      pCVar1 = pCVar1->Parent;
    } while (pCVar1 != (CX3DImporter_NodeElement *)0x0);
  }
  for (; p_Var2 != local_80._M_impl._M_node.super__List_node_base._M_next; p_Var2 = p_Var2->_M_prev)
  {
    local_68.a1 = __return_storage_ptr__->a1;
    local_68.a2 = __return_storage_ptr__->a2;
    local_68.a3 = __return_storage_ptr__->a3;
    local_68.a4 = __return_storage_ptr__->a4;
    local_68.b1 = __return_storage_ptr__->b1;
    local_68.b2 = __return_storage_ptr__->b2;
    local_68.b3 = __return_storage_ptr__->b3;
    local_68.b4 = __return_storage_ptr__->b4;
    local_68.c1 = __return_storage_ptr__->c1;
    local_68.c2 = __return_storage_ptr__->c2;
    local_68.c3 = __return_storage_ptr__->c3;
    local_68.c4 = __return_storage_ptr__->c4;
    local_68.d1 = __return_storage_ptr__->d1;
    local_68.d2 = __return_storage_ptr__->d2;
    local_68.d3 = __return_storage_ptr__->d3;
    local_68.d4 = __return_storage_ptr__->d4;
    aiMatrix4x4t<float>::operator*=(&local_68,(aiMatrix4x4t<float> *)(p_Var2->_M_prev + 1));
    __return_storage_ptr__->d1 = local_68.d1;
    __return_storage_ptr__->d2 = local_68.d2;
    __return_storage_ptr__->d3 = local_68.d3;
    __return_storage_ptr__->d4 = local_68.d4;
    __return_storage_ptr__->c1 = local_68.c1;
    __return_storage_ptr__->c2 = local_68.c2;
    __return_storage_ptr__->c3 = local_68.c3;
    __return_storage_ptr__->c4 = local_68.c4;
    __return_storage_ptr__->b1 = local_68.b1;
    __return_storage_ptr__->b2 = local_68.b2;
    __return_storage_ptr__->b3 = local_68.b3;
    __return_storage_ptr__->b4 = local_68.b4;
    __return_storage_ptr__->a1 = local_68.a1;
    __return_storage_ptr__->a2 = local_68.a2;
    __return_storage_ptr__->a3 = local_68.a3;
    __return_storage_ptr__->a4 = local_68.a4;
  }
  std::__cxx11::_List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::_M_clear
            (&local_80);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent() const
{
    CX3DImporter_NodeElement* cur_node;
    std::list<aiMatrix4x4> matr;
    aiMatrix4x4 out_matr;

	// starting walk from current element to root
	cur_node = NodeElement_Cur;
	if(cur_node != nullptr)
	{
		do
		{
			// if cur_node is group then store group transformation matrix in list.
			if(cur_node->Type == CX3DImporter_NodeElement::ENET_Group) matr.push_back(((CX3DImporter_NodeElement_Group*)cur_node)->Transformation);

			cur_node = cur_node->Parent;
		} while(cur_node != nullptr);
	}

	// multiplicate all matrices in reverse order
	for(std::list<aiMatrix4x4>::reverse_iterator rit = matr.rbegin(); rit != matr.rend(); ++rit) out_matr = out_matr * (*rit);

	return out_matr;
}